

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Cart_get(MPIABI_Comm comm,int maxdims,int *dims,int *periods,int *coords)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_38;
  int *local_30;
  int *coords_local;
  int *periods_local;
  int *dims_local;
  MPIABI_Comm MStack_10;
  int maxdims_local;
  MPIABI_Comm comm_local;
  
  local_30 = coords;
  coords_local = periods;
  periods_local = dims;
  dims_local._4_4_ = maxdims;
  MStack_10 = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_38,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_38);
  iVar1 = MPI_Cart_get(poVar2,dims_local._4_4_,periods_local,coords_local,local_30);
  return iVar1;
}

Assistant:

int MPIABI_Cart_get(
  MPIABI_Comm comm,
  int maxdims,
  int * dims,
  int * periods,
  int * coords
) {
  return MPI_Cart_get(
    (MPI_Comm)(WPI_Comm)comm,
    maxdims,
    dims,
    periods,
    coords
  );
}